

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexFactory.cpp
# Opt level: O2

Mutex * __thiscall MutexFactory::getMutex(MutexFactory *this)

{
  Mutex *this_00;
  
  this_00 = (Mutex *)operator_new(0x18);
  Mutex::Mutex(this_00);
  return this_00;
}

Assistant:

Mutex* MutexFactory::getMutex()
{
	return new Mutex();
}